

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnRefFuncExpr
          (ExprVisitorDelegate *this,RefFuncExpr *expr)

{
  WatWriter *this_00;
  char *local_50;
  
  this_00 = this->writer_;
  Opcode::GetInfo((Opcode *)&Opcode::RefFunc_Opcode);
  WritePuts(this_00,local_50,Space);
  WriteVar(this->writer_,&expr->var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnRefFuncExpr(RefFuncExpr* expr) {
  writer_->WritePutsSpace(Opcode::RefFunc_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Newline);
  return Result::Ok;
}